

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string.h
# Opt level: O0

void __thiscall
google::protobuf::internal::MicroString::
SetInChunks<google::protobuf::internal::(anonymous_namespace)::MicroStringTest_SetInChunksAllowsVeryLargeValues_Test::TestBody()::__0>
          (MicroString *this,size_t size,Arena *arena,anon_class_8_1_a8b0ca64 setter,
          size_t inline_capacity)

{
  bool bVar1;
  LargeRepKind LVar2;
  MicroRep *pMVar3;
  LargeRep *pLVar4;
  StringRep *pSVar5;
  LargeRep *r_1;
  MicroRep *r;
  anon_class_8_1_6b2701bd do_string;
  anon_class_16_2_77b41510 do_owned;
  anon_class_16_2_77b41510 do_micro;
  anon_class_32_4_ddc2fada do_inline;
  anon_class_16_2_90f187bb invoke_setter;
  size_t inline_capacity_local;
  Arena *arena_local;
  size_t size_local;
  MicroString *this_local;
  anon_class_8_1_a8b0ca64 setter_local;
  
  do_inline.invoke_setter = (anon_class_16_2_90f187bb *)&this_local;
  invoke_setter.setter = (anon_class_8_1_a8b0ca64 *)&arena_local;
  do_micro.invoke_setter = (anon_class_16_2_90f187bb *)&arena_local;
  do_inline.size = (size_t *)&invoke_setter.size;
  do_inline.this = (MicroString *)&do_inline.invoke_setter;
  do_owned.invoke_setter = (anon_class_16_2_90f187bb *)&arena_local;
  do_micro.size = (size_t *)&do_inline.invoke_setter;
  do_string.setter = (anon_class_8_1_a8b0ca64 *)&arena_local;
  do_owned.size = (size_t *)&do_inline.invoke_setter;
  r = (MicroRep *)&this_local;
  do_inline.inline_capacity = (size_t *)this;
  invoke_setter.size = (size_t *)inline_capacity;
  arena_local = (Arena *)size;
  size_local = (size_t)this;
  this_local = (MicroString *)setter.total;
  bVar1 = is_inline(this);
  if (bVar1) {
    if (arena_local <= invoke_setter.size) {
      SetInChunks<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc:891:42)>
      ::anon_class_32_4_ddc2fada::operator()((anon_class_32_4_ddc2fada *)&do_micro.invoke_setter);
      return;
    }
  }
  else {
    bVar1 = is_micro_rep(this);
    if (bVar1) {
      pMVar3 = micro_rep(this);
      if (arena_local <= (Arena *)(ulong)pMVar3->capacity) {
        SetInChunks<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc:891:42)>
        ::anon_class_16_2_77b41510::operator()
                  ((anon_class_16_2_77b41510 *)&do_owned.invoke_setter,pMVar3);
        return;
      }
    }
    else {
      bVar1 = is_large_rep(this);
      if ((bVar1) && (LVar2 = large_rep_kind(this), kUnowned < LVar2)) {
        if (LVar2 == kString) {
          pSVar5 = string_rep(this);
          SetInChunks<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc:891:42)>
          ::anon_class_8_1_6b2701bd::operator()((anon_class_8_1_6b2701bd *)&r,pSVar5);
          return;
        }
        if ((LVar2 == kOwned) &&
           (pLVar4 = large_rep(this), arena_local <= (Arena *)(ulong)pLVar4->capacity)) {
          SetInChunks<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc:891:42)>
          ::anon_class_16_2_77b41510::operator()((anon_class_16_2_77b41510 *)&do_string,pLVar4);
          return;
        }
      }
    }
  }
  if (arena == (Arena *)0x0) {
    Destroy(this);
  }
  if (invoke_setter.size < arena_local) {
    if (arena_local < (Arena *)0x100) {
      pMVar3 = AllocateMicroRep(this,(size_t)arena_local,arena);
      SetInChunks<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc:891:42)>
      ::anon_class_16_2_77b41510::operator()
                ((anon_class_16_2_77b41510 *)&do_owned.invoke_setter,pMVar3);
    }
    else if (arena_local < (Arena *)0x2faf081) {
      pLVar4 = AllocateOwnedRep(this,(size_t)arena_local,arena);
      SetInChunks<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc:891:42)>
      ::anon_class_16_2_77b41510::operator()((anon_class_16_2_77b41510 *)&do_string,pLVar4);
    }
    else {
      pSVar5 = AllocateStringRep(this,arena);
      SetInChunks<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc:891:42)>
      ::anon_class_8_1_6b2701bd::operator()((anon_class_8_1_6b2701bd *)&r,pSVar5);
    }
  }
  else {
    set_inline_size(this,0);
    SetInChunks<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc:891:42)>
    ::anon_class_32_4_ddc2fada::operator()((anon_class_32_4_ddc2fada *)&do_micro.invoke_setter);
  }
  return;
}

Assistant:

void MicroString::SetInChunks(size_t size, Arena* arena, F setter,
                              size_t inline_capacity) {
  const auto invoke_setter = [&](char* p) {
    char* start = p;
    setter([&](absl::string_view chunk) {
      ABSL_DCHECK_LE(p - start + chunk.size(), size);
      memcpy(p, chunk.data(), chunk.size());
      p += chunk.size();
    });
    return p - start;
  };

  const auto do_inline = [&] {
    ABSL_DCHECK_LE(size, inline_capacity);
    set_inline_size(invoke_setter(inline_head()));
  };

  const auto do_micro = [&](MicroRep* r) {
    ABSL_DCHECK_LE(size, r->capacity);
    r->ChangeSize(invoke_setter(r->data()));
  };

  const auto do_owned = [&](LargeRep* r) {
    ABSL_DCHECK_LE(size, r->capacity);
    r->ChangeSize(invoke_setter(r->owned_head()));
  };

  const auto do_string = [&](StringRep* r) {
    r->str.clear();
    setter([&](absl::string_view chunk) {
      r->str.append(chunk.data(), chunk.size());
    });
    r->ResetBase();
  };

  if (is_inline()) {
    if (size <= inline_capacity) {
      return do_inline();
    }
  } else if (is_micro_rep()) {
    if (auto* r = micro_rep(); size <= r->capacity) {
      return do_micro(r);
    }
  } else if (is_large_rep()) {
    switch (large_rep_kind()) {
      case kOwned:
        if (auto* r = large_rep(); size <= r->capacity) {
          return do_owned(r);
        }
        break;
      case kString:
        return do_string(string_rep());
      case kAlias:
      case kUnowned:
        break;
    }
  }

  // Copied from ParseContext as an acceptable size that we can preallocate
  // without verifying.
  static constexpr size_t kSafeStringSize = 50000000;

  // We didn't have space for it, so allocate the space and dispatch.
  if (arena == nullptr) Destroy();

  if (size <= inline_capacity) {
    set_inline_size(0);
    do_inline();
  } else if (size <= kMaxMicroRepCapacity) {
    do_micro(AllocateMicroRep(size, arena));
  } else if (size <= kSafeStringSize) {
    do_owned(AllocateOwnedRep(size, arena));
  } else {
    // Fallback to using std::string and normal growth instead of reserving.
    do_string(AllocateStringRep(arena));
  }
}